

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.h
# Opt level: O0

void __thiscall
ezy::detail::
range_view_slice<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>
::range_view_slice(range_view_slice<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>
                   *this,keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>
                         *orig,size_type f,size_type u)

{
  logic_error *this_00;
  size_type u_local;
  size_type f_local;
  keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>
  *orig_local;
  range_view_slice<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>
  *this_local;
  
  (this->orig_range).t = orig->t;
  this->from = f;
  this->until = u;
  if (this->until < this->from) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"logic error");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

constexpr range_view_slice(Keeper&& orig, size_type f, size_type u)
        : orig_range(std::move(orig))
        , from(f)
        , until(u)
      {
        if (from > until)
          throw std::logic_error("logic error"); // programming error
      }